

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O1

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks,_Bool nonblocking)

{
  int iVar1;
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,nonblocking) != 0) {
    type = type | 0x800;
  }
  iVar1 = socketpair(domain,type,protocol,socks);
  return -(uint)(iVar1 != 0);
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2], bool nonblocking)
{
#ifdef SOCK_NONBLOCK
  type = nonblocking ? type | SOCK_NONBLOCK : type;
#endif
  if(socketpair(domain, type, protocol, socks))
    return -1;
#ifndef SOCK_NONBLOCK
  if(nonblocking) {
    if(curlx_nonblock(socks[0], TRUE) < 0 ||
       curlx_nonblock(socks[1], TRUE) < 0) {
      close(socks[0]);
      close(socks[1]);
      return -1;
    }
  }
#endif
  return 0;
}